

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

Literals * wasm::Properties::getLiterals(Literals *__return_storage_ptr__,Expression *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  bool bVar2;
  Expression **ppEVar3;
  initializer_list<wasm::Literal> init;
  Literal local_58;
  undefined1 local_40 [8];
  Iterator __begin4;
  
  bVar2 = isSingleConstantExpression(curr);
  if (bVar2) {
    getLiteral(&local_58,curr);
    init._M_len = 1;
    init._M_array = &local_58;
    Literals::Literals(__return_storage_ptr__,init);
    Literal::~Literal(&local_58);
  }
  else {
    if (curr->_id != TupleMakeId) {
      handle_unreachable("non-constant expression",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                         ,0x93);
    }
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar1 = (ArenaVector<wasm::Expression_*> *)curr[1].type.id;
    local_40 = (undefined1  [8])(curr + 1);
    while ((__begin4.parent != pAVar1 || (local_40 != (undefined1  [8])(curr + 1)))) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_40);
      getLiteral(&local_58,*ppEVar3);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_58);
      Literal::~Literal(&local_58);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literals getLiterals(const Expression* curr) {
  if (isSingleConstantExpression(curr)) {
    return {getLiteral(curr)};
  } else if (auto* tuple = curr->dynCast<TupleMake>()) {
    Literals literals;
    for (auto* op : tuple->operands) {
      literals.push_back(getLiteral(op));
    }
    return literals;
  } else {
    WASM_UNREACHABLE("non-constant expression");
  }
}